

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O0

void __thiscall
LinkedListPool<depspawn::internal::arg_info,_true,_false>::LinkedListPool
          (LinkedListPool<depspawn::internal::arg_info,_true,_false> *this,int chunkSize,
          size_t min_t_size)

{
  atomic<depspawn::internal::arg_info_*> *in_RDX;
  int in_ESI;
  long in_RDI;
  uint in_stack_ffffffffffffffa8;
  bool __i;
  int local_3c;
  undefined4 in_stack_fffffffffffffff0;
  
  std::vector<depspawn::internal::arg_info_*,_std::allocator<depspawn::internal::arg_info_*>_>::
  vector((vector<depspawn::internal::arg_info_*,_std::allocator<depspawn::internal::arg_info_*>_> *)
         0x13bad1);
  local_3c = in_ESI;
  if (in_ESI < 1) {
    local_3c = 1;
  }
  *(int *)(in_RDI + 0x18) = local_3c;
  if (in_RDX < (atomic<depspawn::internal::arg_info_*> *)0x28) {
    in_RDX = (atomic<depspawn::internal::arg_info_*> *)0x28;
  }
  *(int *)(in_RDI + 0x1c) = (int)in_RDX;
  __i = false;
  std::atomic<depspawn::internal::arg_info_*>::atomic
            (in_RDX,(__pointer_type)(ulong)in_stack_ffffffffffffffa8);
  std::atomic_flag::atomic_flag((atomic_flag *)in_RDX,__i);
  allocate((LinkedListPool<depspawn::internal::arg_info,_true,_false> *)
           CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  return;
}

Assistant:

LinkedListPool(const int chunkSize = 1, const size_t min_t_size = sizeof(T)) :
  chunkSize_{(chunkSize < 1) ? 1 : chunkSize},
  minTSize_{static_cast<int>((sizeof(T) > min_t_size) ? sizeof(T) : min_t_size)},
  head_{nullptr}
  {
    allocate();
  }